

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void expand_right_edge(JSAMPARRAY image_data,int num_rows,JDIMENSION input_cols,
                      JDIMENSION output_cols)

{
  JSAMPLE JVar1;
  ulong uVar2;
  ulong uVar3;
  JSAMPLE *pJVar4;
  int iVar5;
  
  if (0 < (int)(output_cols - input_cols)) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)num_rows;
    if (num_rows < 1) {
      uVar3 = uVar2;
    }
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      JVar1 = image_data[uVar2][(ulong)input_cols - 1];
      pJVar4 = image_data[uVar2] + input_cols;
      for (iVar5 = output_cols - input_cols; 0 < iVar5; iVar5 = iVar5 + -1) {
        *pJVar4 = JVar1;
        pJVar4 = pJVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
expand_right_edge(JSAMPARRAY image_data, int num_rows, JDIMENSION input_cols,
                  JDIMENSION output_cols)
{
  register JSAMPROW ptr;
  register JSAMPLE pixval;
  register int count;
  int row;
  int numcols = (int)(output_cols - input_cols);

  if (numcols > 0) {
    for (row = 0; row < num_rows; row++) {
      ptr = image_data[row] + input_cols;
      pixval = ptr[-1];
      for (count = numcols; count > 0; count--)
        *ptr++ = pixval;
    }
  }
}